

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void load_replay_kvs(storage_t *st,fdb_kvs_handle *replay_kvs,fdb_seqnum_t seqnum)

{
  fdb_status fVar1;
  fdb_seqnum_t in_RDX;
  fdb_doc **in_RSI;
  fdb_iterator *in_RDI;
  transaction_t *tx;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_iterator *it;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_iterator *iterator;
  fdb_iterator *iterator_00;
  fdb_iterator *local_70;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  fdb_kvs_handle *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  fdb_kvs_handle *handle;
  timeval local_28;
  fdb_seqnum_t local_18;
  
  local_18 = in_RDX;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  iterator_00 = (fdb_iterator *)0x0;
  fVar1 = fdb_iterator_sequence_init((fdb_kvs_handle *)in_RDI->wal_itr,&local_70,0,local_18,0);
  handle = (fdb_kvs_handle *)local_28.tv_sec;
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
            ,0x129);
    load_replay_kvs::__test_pass = 0;
    handle = (fdb_kvs_handle *)local_28.tv_sec;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x129,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
    }
  }
  do {
    fVar1 = fdb_iterator_get(in_RDI,in_RSI);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x12d);
      load_replay_kvs::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x12d,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
      }
    }
    iterator = (fdb_iterator *)iterator_00->tree_cursor_prev;
    if (((short)iterator[6]._offset == 1) &&
       (fVar1 = fdb_set_kv(handle,in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
       fVar1 != FDB_RESULT_SUCCESS)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x135);
      load_replay_kvs::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x135,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
      }
    }
    if (((short)iterator[6]._offset == 2) &&
       (fVar1 = fdb_del_kv(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff98), fVar1 != FDB_RESULT_SUCCESS)) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x13b);
      load_replay_kvs::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x13b,"void load_replay_kvs(storage_t *, fdb_kvs_handle *, fdb_seqnum_t)");
      }
    }
    fdb_doc_free((fdb_doc *)0x104658);
    iterator_00 = (fdb_iterator *)0x0;
    fVar1 = fdb_iterator_next(iterator);
  } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
  fdb_iterator_close(iterator_00);
  return;
}

Assistant:

void load_replay_kvs(storage_t *st, fdb_kvs_handle *replay_kvs, fdb_seqnum_t seqnum) {

    TEST_INIT();

    fdb_iterator *it;
    fdb_doc *rdoc = NULL;
    fdb_status status;
    transaction_t *tx;


    // iterator end at seqnum
    status = fdb_iterator_sequence_init(st->rtx, &it, 0, seqnum,
                                        FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    do {
        status = fdb_iterator_get(it, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        tx = (transaction_t *)rdoc->body;
        if (tx->type == SET_PERSON) {
            status = fdb_set_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len,
                                NULL,0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        if (tx->type == DEL_PERSON) {
            status = fdb_del_kv(replay_kvs,
                                tx->refkey,
                                tx->refkey_len);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        fdb_doc_free(rdoc);
        rdoc=NULL;

    } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
    fdb_iterator_close(it);

}